

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O1

bool parseDouble(Option *O,StringRef Arg,double *Value)

{
  char cVar1;
  double dVar2;
  Child LHS;
  Child CVar3;
  raw_ostream *Errs;
  Child RHS;
  StringRef SVar4;
  SmallString<32U> Storage;
  Child local_98;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  NodeKind local_88;
  char cStack_87;
  undefined6 uStack_86;
  Child local_80;
  undefined4 uStack_78;
  undefined4 uStack_74;
  NodeKind local_70;
  char cStack_6f;
  undefined6 uStack_6e;
  Child local_68;
  undefined8 uStack_60;
  undefined8 local_58 [4];
  StringRef local_38;
  
  local_38.Length = Arg.Length;
  local_38.Data = Arg.Data;
  llvm::Twine::Twine((Twine *)&local_80,&local_38);
  uStack_60 = 0x2000000000;
  local_68.twine = (Twine *)local_58;
  SVar4 = llvm::Twine::toNullTerminatedStringRef
                    ((Twine *)&local_80,(SmallVectorImpl<char> *)&local_68);
  dVar2 = strtod(SVar4.Data,&local_98.cString);
  cVar1 = *(char *)CONCAT44(local_98._4_4_,local_98.decUI);
  if (cVar1 == '\0') {
    *Value = dVar2;
  }
  if (local_68.twine != (Twine *)local_58) {
    free(local_68.twine);
  }
  if (cVar1 == '\0') goto LAB_00115186;
  llvm::Twine::Twine((Twine *)&local_80,"\'",&local_38);
  llvm::Twine::Twine((Twine *)&local_98,"\' value invalid for floating point argument!");
  if ((local_70 == NullKind) || (local_88 == NullKind)) {
    local_58[0] = CONCAT62(local_58[0]._2_6_,0x100);
  }
  else {
    if (local_70 == EmptyKind) {
      local_58[0] = CONCAT62(uStack_86,CONCAT11(cStack_87,local_88));
    }
    else {
      if (local_88 != EmptyKind) {
        LHS._4_4_ = local_80._4_4_;
        LHS.decUI = local_80.decUI;
        if (cStack_6f != '\x01') {
          local_70 = TwineKind;
          LHS.twine = (Twine *)&local_80;
        }
        if (cStack_87 != '\x01') {
          local_88 = TwineKind;
        }
        CVar3._4_4_ = local_98._4_4_;
        CVar3.decUI = local_98.decUI;
        RHS.twine = (Twine *)&local_98;
        if (cStack_87 == '\x01') {
          RHS = CVar3;
        }
        llvm::Twine::Twine((Twine *)&local_68,LHS,local_70,RHS,local_88);
        goto LAB_0011516d;
      }
      local_58[0] = CONCAT62(uStack_6e,CONCAT11(cStack_6f,local_70));
      local_98.decUI = local_80.decUI;
      local_98._4_4_ = local_80._4_4_;
      uStack_90 = uStack_78;
      uStack_8c = uStack_74;
    }
    local_68._4_4_ = local_98._4_4_;
    local_68.decUI = local_98.decUI;
    uStack_60 = CONCAT44(uStack_8c,uStack_90);
  }
LAB_0011516d:
  Errs = llvm::errs();
  llvm::cl::Option::error(O,(Twine *)&local_68,(StringRef)ZEXT816(0),Errs);
LAB_00115186:
  return cVar1 != '\0';
}

Assistant:

static bool parseDouble(Option &O, StringRef Arg, double &Value) {
  if (to_float(Arg, Value))
    return false;
  return O.error("'" + Arg + "' value invalid for floating point argument!");
}